

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix3 * matrix3_make_transformation_translationv2(matrix3 *self,vector2 *translation)

{
  (self->field_0).m[0] = 1.0;
  (self->field_0).m[1] = 0.0;
  (self->field_0).m[2] = 0.0;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[4] = 1.0;
  (self->field_0).m[5] = 0.0;
  (self->field_0).m[6] = 0.0;
  (self->field_0).m[7] = 0.0;
  (self->field_0).m[8] = 1.0;
  (self->field_0).m[2] = (translation->field_0).v[0];
  (self->field_0).m[5] = (translation->field_0).v[1];
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_make_transformation_translationv2(struct matrix3 *self, const struct vector2 *translation)
{
	matrix3_identity(self);

	self->r02 = translation->x;
	self->r12 = translation->y;

	return self;
}